

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QSharedDataPointer<QNetworkInterfacePrivate>>::
emplace<QSharedDataPointer<QNetworkInterfacePrivate>>
          (QMovableArrayOps<QSharedDataPointer<QNetworkInterfacePrivate>> *this,qsizetype i,
          QSharedDataPointer<QNetworkInterfacePrivate> *args)

{
  long lVar1;
  long lVar2;
  QNetworkInterfacePrivate *pQVar3;
  qsizetype qVar4;
  totally_ordered_wrapper<QNetworkInterfacePrivate_*> __old_val;
  long in_FS_OFFSET;
  Inserter local_60;
  QSharedDataPointer<QNetworkInterfacePrivate> local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int **)this != (int *)0x0) && (**(int **)this < 2)) {
    if (*(long *)(this + 0x10) == i) {
      qVar4 = QArrayDataPointer<QSharedDataPointer<QNetworkInterfacePrivate>_>::freeSpaceAtEnd
                        ((QArrayDataPointer<QSharedDataPointer<QNetworkInterfacePrivate>_> *)this);
      if (qVar4 == 0) goto LAB_001aec53;
      lVar1 = *(long *)(this + 8);
      lVar2 = *(long *)(this + 0x10);
      pQVar3 = (args->d).ptr;
      (args->d).ptr = (QNetworkInterfacePrivate *)0x0;
      *(QNetworkInterfacePrivate **)(lVar1 + lVar2 * 8) = pQVar3;
LAB_001aed26:
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      goto LAB_001aece4;
    }
LAB_001aec53:
    if (i == 0) {
      qVar4 = QArrayDataPointer<QSharedDataPointer<QNetworkInterfacePrivate>_>::freeSpaceAtBegin
                        ((QArrayDataPointer<QSharedDataPointer<QNetworkInterfacePrivate>_> *)this);
      if (qVar4 != 0) {
        lVar1 = *(long *)(this + 8);
        pQVar3 = (args->d).ptr;
        (args->d).ptr = (QNetworkInterfacePrivate *)0x0;
        *(QNetworkInterfacePrivate **)(lVar1 + -8) = pQVar3;
        *(long *)(this + 8) = *(long *)(this + 8) + -8;
        goto LAB_001aed26;
      }
    }
  }
  pQVar3 = (args->d).ptr;
  (args->d).ptr = (QNetworkInterfacePrivate *)0x0;
  lVar1 = *(long *)(this + 0x10);
  QArrayDataPointer<QSharedDataPointer<QNetworkInterfacePrivate>_>::detachAndGrow
            ((QArrayDataPointer<QSharedDataPointer<QNetworkInterfacePrivate>_> *)this,
             (uint)(i == 0 && lVar1 != 0),1,(QSharedDataPointer<QNetworkInterfacePrivate> **)0x0,
             (QArrayDataPointer<QSharedDataPointer<QNetworkInterfacePrivate>_> *)0x0);
  if (i == 0 && lVar1 != 0) {
    *(QNetworkInterfacePrivate **)(*(long *)(this + 8) + -8) = pQVar3;
    *(long *)(this + 8) = *(long *)(this + 8) + -8;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  else {
    QMovableArrayOps<QSharedDataPointer<QNetworkInterfacePrivate>_>::Inserter::Inserter
              (&local_60,(QArrayDataPointer<QSharedDataPointer<QNetworkInterfacePrivate>_> *)this,i,
               1);
    ((local_60.displaceFrom)->d).ptr = pQVar3;
    local_60.displaceFrom = local_60.displaceFrom + 1;
    (local_60.data)->size = (local_60.data)->size + local_60.nInserts;
  }
  local_38.d.ptr =
       (totally_ordered_wrapper<QNetworkInterfacePrivate_*>)(QNetworkInterfacePrivate *)0x0;
  QSharedDataPointer<QNetworkInterfacePrivate>::~QSharedDataPointer(&local_38);
LAB_001aece4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }